

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O2

void u_flushDefaultConverter_63(void)

{
  UConverter *converter;
  
  if (gDefaultConverter == (UConverter *)0x0) {
    return;
  }
  umtx_lock_63((UMutex *)0x0);
  converter = gDefaultConverter;
  if (gDefaultConverter != (UConverter *)0x0) {
    gDefaultConverter = (UConverter *)0x0;
    umtx_unlock_63((UMutex *)0x0);
    ucnv_close_63(converter);
    return;
  }
  umtx_unlock_63((UMutex *)0x0);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_flushDefaultConverter()
{
    UConverter *converter = NULL;
    
    if (gDefaultConverter != NULL) {
        umtx_lock(NULL);
        
        /* need to check to make sure it wasn't taken out from under us */
        if (gDefaultConverter != NULL) {
            converter = gDefaultConverter;
            gDefaultConverter = NULL;
        }
        umtx_unlock(NULL);
    }

    /* if the cache was populated, flush it */
    if(converter != NULL) {
         ucnv_close(converter);
    }
}